

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O2

void __thiscall
asio::detail::epoll_reactor::schedule_timer<asio::time_traits<boost::posix_time::ptime>>
          (epoll_reactor *this,timer_queue<asio::time_traits<boost::posix_time::ptime>_> *queue,
          time_type *time,per_timer_data *timer,wait_op *op)

{
  atomic_count *paVar1;
  bool bVar2;
  scoped_lock lock;
  scoped_lock sStack_38;
  
  conditionally_enabled_mutex::scoped_lock::scoped_lock(&sStack_38,&this->mutex_);
  if (this->shutdown_ == true) {
    scheduler::post_immediate_completion(this->scheduler_,&op->super_operation,false);
  }
  else {
    bVar2 = timer_queue<asio::detail::forwarding_posix_time_traits>::enqueue_timer
                      (&queue->impl_,time,timer,op);
    LOCK();
    paVar1 = &this->scheduler_->outstanding_work_;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    if (bVar2) {
      update_timeout(this);
    }
  }
  conditionally_enabled_mutex::scoped_lock::~scoped_lock(&sStack_38);
  return;
}

Assistant:

void epoll_reactor::schedule_timer(timer_queue<Time_Traits>& queue,
    const typename Time_Traits::time_type& time,
    typename timer_queue<Time_Traits>::per_timer_data& timer, wait_op* op)
{
  mutex::scoped_lock lock(mutex_);

  if (shutdown_)
  {
    scheduler_.post_immediate_completion(op, false);
    return;
  }

  bool earliest = queue.enqueue_timer(time, timer, op);
  scheduler_.work_started();
  if (earliest)
    update_timeout();
}